

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_GetMethodPropertyScoped_NoFastPath<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  PropertyId propertyId_00;
  Var pvVar1;
  FunctionBody *functionBody;
  InlineCache *inlineCache;
  Var value;
  Var instance;
  PropertyId propertyId;
  OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  propertyId_00 = GetPropertyIdFromCacheId(this,playout->inlineCacheIndex);
  pvVar1 = GetReg<unsigned_int>(this,playout->Instance);
  functionBody = GetFunctionBody(this);
  inlineCache = GetInlineCache(this,playout->inlineCacheIndex);
  pvVar1 = Js::JavascriptOperators::PatchScopedGetMethod<false,Js::InlineCache>
                     (functionBody,inlineCache,playout->inlineCacheIndex,pvVar1,propertyId_00);
  SetReg<unsigned_int>(this,playout->Value,pvVar1);
  return;
}

Assistant:

_NOINLINE void InterpreterStackFrame::OP_GetMethodPropertyScoped_NoFastPath(unaligned T *playout)
    {
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        Js::Var instance = GetReg(playout->Instance);

        Js::Var value = JavascriptOperators::PatchScopedGetMethod<false>(
            GetFunctionBody(),
            GetInlineCache(playout->inlineCacheIndex),
            playout->inlineCacheIndex,
            instance,
            propertyId
            );

        SetReg(playout->Value, value);

#ifdef TELEMETRY_INTERPRETER
        if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
        {
            // `successful` will be true as PatchGetMethod throws an exception if not found.
            this->scriptContext->GetTelemetry().GetOpcodeTelemetry().GetMethodProperty(instance, propertyId, value, true);
        }
#endif

    }